

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TrackJamTargetIdentifier.cpp
# Opt level: O2

void __thiscall
KDIS::DATA_TYPE::TrackJamTargetIdentifier::Encode
          (TrackJamTargetIdentifier *this,KDataStream *stream)

{
  KDataStream::Write<unsigned_short>
            (stream,(this->super_EntityIdentifier).super_SimulationIdentifier.m_ui16SiteID);
  KDataStream::Write<unsigned_short>
            (stream,(this->super_EntityIdentifier).super_SimulationIdentifier.m_ui16ApplicationID);
  KDataStream::Write<unsigned_short>
            (stream,*(unsigned_short *)
                     &(this->super_EntityIdentifier).super_SimulationIdentifier.field_0xc);
  KDataStream::Write(stream,(this->super_EntityIdentifier).super_SimulationIdentifier.field_0xe);
  KDataStream::Write(stream,(this->super_EntityIdentifier).super_SimulationIdentifier.field_0xf);
  return;
}

Assistant:

void TrackJamTargetIdentifier::Encode( KDataStream & stream ) const
{
    stream << m_ui16SiteID
           << m_ui16ApplicationID
           << m_ui16EntityID
           << m_ui8EmitterID
           << m_ui8BeamID;
}